

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

void __thiscall
osc::ReceivedMessageArgument::AsBlob
          (ReceivedMessageArgument *this,void **data,osc_bundle_element_size_t *size)

{
  MissingArgumentException *this_00;
  WrongArgumentTypeException *this_01;
  osc_bundle_element_size_t *size_local;
  void **data_local;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  if (*this->typeTagPtr_ == 'b') {
    AsBlobUnchecked(this,data,size);
    return;
  }
  this_01 = (WrongArgumentTypeException *)__cxa_allocate_exception(0x10);
  WrongArgumentTypeException::WrongArgumentTypeException(this_01,"wrong argument type");
  __cxa_throw(this_01,&WrongArgumentTypeException::typeinfo,
              WrongArgumentTypeException::~WrongArgumentTypeException);
}

Assistant:

void ReceivedMessageArgument::AsBlob( const void*& data, osc_bundle_element_size_t& size ) const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == BLOB_TYPE_TAG )
		AsBlobUnchecked( data, size );
	else
		throw WrongArgumentTypeException();
}